

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_eol
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte *pbVar2;
  byte in_SIL;
  byte *in_RDI;
  char_t ss;
  gap g;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  gap *in_stack_ffffffffffffffd8;
  gap *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  byte *local_10;
  
  gap::gap((gap *)&stack0xffffffffffffffd8);
  local_10 = in_RDI;
  do {
    while (bVar3 = *local_10, ((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
LAB_00edb9ca:
      if (*local_10 == in_SIL) {
        pcVar1 = gap::flush(in_stack_ffffffffffffffd8,
                            (char_t *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
        *pcVar1 = '\0';
        return (char_t *)(local_10 + 1);
      }
      if (*local_10 == 0xd) {
        pbVar2 = local_10 + 1;
        *local_10 = 10;
        local_10 = pbVar2;
        if (*pbVar2 == 10) {
          gap::push(in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->end,
                    CONCAT17(bVar3,in_stack_ffffffffffffffd0));
        }
      }
      else if (*local_10 == 0x26) {
        local_10 = (byte *)strconv_escape((char_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                                          in_stack_ffffffffffffffe0);
      }
      else {
        if (*local_10 == 0) {
          return (char_t *)0x0;
        }
        local_10 = local_10 + 1;
      }
    }
    bVar3 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
      local_10 = local_10 + 1;
      goto LAB_00edb9ca;
    }
    bVar3 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
      local_10 = local_10 + 2;
      goto LAB_00edb9ca;
    }
    bVar3 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar3] & 2) != 0) {
      local_10 = local_10 + 3;
      goto LAB_00edb9ca;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}